

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecuteProcessCommand.cxx
# Opt level: O3

bool __thiscall
cmExecuteProcessCommand::InitialPass
          (cmExecuteProcessCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  pointer pcVar2;
  pointer pcVar3;
  undefined8 uVar4;
  size_type sVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  Encoding encoding;
  undefined8 *puVar9;
  pointer ppVar10;
  cmsysProcess *cp;
  string *psVar11;
  offset_in_Arguments_to_vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  in_RCX;
  pointer *pppVar12;
  cmMakefile *pcVar13;
  const_iterator __end0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  char *pcVar15;
  ulong uVar16;
  ostream *poVar17;
  vector<char,std::allocator<char>> *pvVar18;
  _Alloc_hider _Var19;
  int idx;
  const_iterator __begin0;
  pointer pbVar20;
  size_t sVar21;
  string_view arg;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  static_string_view name_02;
  static_string_view name_03;
  static_string_view name_04;
  static_string_view name_05;
  static_string_view name_06;
  static_string_view name_07;
  static_string_view name_08;
  static_string_view name_09;
  static_string_view name_10;
  static_string_view name_11;
  static_string_view name_12;
  static_string_view name_13;
  static_string_view name_14;
  cmProcessOutput processOutput;
  string echo_output;
  string strdata;
  int length;
  vector<char,_std::allocator<char>_> tempError;
  vector<char,_std::allocator<char>_> tempOutput;
  char buf [16];
  char *data;
  double timeout;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keywordsMissingValue;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unparsedArguments;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  res;
  Arguments arguments;
  cmProcessOutput local_369;
  cmCommand *local_368;
  undefined1 local_360 [16];
  undefined1 auStack_350 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  undefined4 local_320;
  int local_31c;
  vector<char,_std::allocator<char>_> local_318;
  vector<char,_std::allocator<char>_> local_2f8;
  string local_2d8;
  int local_2ac;
  char *local_2a8;
  double local_2a0;
  _Vector_base<char,_std::allocator<char>_> local_298;
  _Vector_base<char,_std::allocator<char>_> local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_258;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_218;
  undefined1 local_1f8 [24];
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  _Alloc_hider local_160;
  size_type local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  _Alloc_hider local_140;
  size_type local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  string local_120;
  _Alloc_hider local_100;
  size_t local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  _Alloc_hider local_e0;
  size_type local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  _Alloc_hider local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  undefined4 local_a0;
  string local_98;
  string local_70;
  string local_50;
  
  local_368 = &this->super_cmCommand;
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_360._0_8_ = (ActionMap *)0x29;
    local_1f8._0_8_ = local_1f8 + 0x10;
    local_1f8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1f8,(ulong)local_360);
    local_1f8._16_8_ = local_360._0_8_;
    builtin_strncpy((char *)local_1f8._0_8_,"called with incorrect number of arguments",0x29);
    local_1f8._8_8_ = local_360._0_8_;
    *(char *)(local_1f8._0_8_ + local_360._0_8_) = '\0';
    cmCommand::SetError(local_368,(string *)local_1f8);
    if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
      operator_delete((void *)local_1f8._0_8_,(ulong)(local_1f8._16_8_ + 1));
    }
    return false;
  }
  if ((InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::parser == '\0') &&
     (iVar7 = __cxa_guard_acquire(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::parser), iVar7 != 0)) {
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (pointer)0x0;
    local_1f8._16_8_ = 0;
    name.super_string_view._M_str = "COMMAND";
    name.super_string_view._M_len = 7;
    cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::
    Bind<std::vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              ((cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_1f8,name,in_RCX);
    name_00.super_string_view._M_str = "COMMAND_ECHO";
    name_00.super_string_view._M_len = 0xc;
    cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_1f8,name_00,0x138);
    name_01.super_string_view._M_str = "OUTPUT_VARIABLE";
    name_01.super_string_view._M_len = 0xf;
    cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_1f8,name_01,0x18);
    name_02.super_string_view._M_str = "ERROR_VARIABLE";
    name_02.super_string_view._M_len = 0xe;
    cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_1f8,name_02,0x38);
    name_03.super_string_view._M_str = "RESULT_VARIABLE";
    name_03.super_string_view._M_len = 0xf;
    cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_1f8,name_03,0x58);
    name_04.super_string_view._M_str = "RESULTS_VARIABLE";
    name_04.super_string_view._M_len = 0x10;
    cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_1f8,name_04,0x78);
    name_05.super_string_view._M_str = "WORKING_DIRECTORY";
    name_05.super_string_view._M_len = 0x11;
    cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_1f8,name_05,0x98);
    name_06.super_string_view._M_str = "INPUT_FILE";
    name_06.super_string_view._M_len = 10;
    cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_1f8,name_06,0xb8);
    name_07.super_string_view._M_str = "OUTPUT_FILE";
    name_07.super_string_view._M_len = 0xb;
    cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_1f8,name_07,0xd8);
    name_08.super_string_view._M_str = "ERROR_FILE";
    name_08.super_string_view._M_len = 10;
    cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_1f8,name_08,0xf8);
    name_09.super_string_view._M_str = "TIMEOUT";
    name_09.super_string_view._M_len = 7;
    cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_1f8,name_09,0x118);
    name_10.super_string_view._M_str = "OUTPUT_QUIET";
    name_10.super_string_view._M_len = 0xc;
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)local_1f8,name_10,0x158);
    name_11.super_string_view._M_str = "ERROR_QUIET";
    name_11.super_string_view._M_len = 0xb;
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)local_1f8,name_11,0x159);
    name_12.super_string_view._M_str = "OUTPUT_STRIP_TRAILING_WHITESPACE";
    name_12.super_string_view._M_len = 0x20;
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)local_1f8,name_12,0x15a);
    name_13.super_string_view._M_str = "ERROR_STRIP_TRAILING_WHITESPACE";
    name_13.super_string_view._M_len = 0x1f;
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)local_1f8,name_13,0x15b);
    name_14.super_string_view._M_str = "ENCODING";
    name_14.super_string_view._M_len = 8;
    cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_1f8,name_14,0x160);
    std::
    vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    ::vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
              *)&InitialPass::parser,
             (vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
              *)local_1f8);
    std::
    vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
               *)local_1f8);
    __cxa_atexit(cmArgumentParser<Arguments>::~cmArgumentParser,&InitialPass::parser,&__dso_handle);
    __cxa_guard_release(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::parser);
  }
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pbVar20 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  local_1f8._16_8_ = 0;
  local_1f8._0_8_ =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  local_1f8._8_8_ = (pointer)0x0;
  local_1e0._M_string_length = 0;
  local_1e0.field_2._M_local_buf[0] = '\0';
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  local_1c0._M_string_length = 0;
  local_1c0.field_2._M_local_buf[0] = '\0';
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  local_1a0._M_string_length = 0;
  local_1a0.field_2._M_local_buf[0] = '\0';
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  local_180._M_string_length = 0;
  local_180.field_2._M_local_buf[0] = '\0';
  local_160._M_p = (pointer)&local_150;
  local_158 = 0;
  local_150._M_local_buf[0] = '\0';
  local_140._M_p = (pointer)&local_130;
  local_138 = 0;
  local_130._M_local_buf[0] = '\0';
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  local_120._M_string_length = 0;
  local_120.field_2._M_local_buf[0] = '\0';
  local_100._M_p = (pointer)&local_f0;
  local_f8 = 0;
  local_f0._M_local_buf[0] = '\0';
  local_e0._M_p = (pointer)&local_d0;
  local_d8 = 0;
  local_d0._M_local_buf[0] = '\0';
  local_c0._M_p = (pointer)&local_b0;
  local_b8 = 0;
  local_b0._M_local_buf[0] = '\0';
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_a0._0_1_ = false;
  local_a0._1_1_ = false;
  local_a0._2_1_ = false;
  local_a0._3_1_ = false;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  local_360._0_8_ = &InitialPass::parser;
  local_360._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  auStack_350._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  auStack_350._8_8_ = auStack_350._8_8_ & 0xffffffffffffff00;
  if (pbVar20 != pbVar1) {
    do {
      arg._M_str = (pbVar20->_M_dataplus)._M_p;
      arg._M_len = pbVar20->_M_string_length;
      ArgumentParser::Instance::Consume((Instance *)local_360,arg,local_1f8,&local_238,&local_258);
      pbVar20 = pbVar20 + 1;
    } while (pbVar20 != pbVar1);
    if (local_258.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_258.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      if (local_238.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_238.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0023bd8e;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (auStack_350 + 0x10)," given unknown argument \"",
                     local_238.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
      puVar9 = (undefined8 *)std::__cxx11::string::append(auStack_350 + 0x10);
      local_360._0_8_ = auStack_350;
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 == paVar14) {
        auStack_350._0_8_ = paVar14->_M_allocated_capacity;
        auStack_350._8_8_ = puVar9[3];
      }
      else {
        auStack_350._0_8_ = paVar14->_M_allocated_capacity;
        local_360._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar9;
      }
      local_360._8_8_ = puVar9[1];
      *puVar9 = paVar14;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      cmCommand::SetError(local_368,(string *)local_360);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (auStack_350 + 0x10)," called with no value for ",
                     local_258.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
      puVar9 = (undefined8 *)std::__cxx11::string::append(auStack_350 + 0x10);
      local_360._0_8_ = auStack_350;
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 == paVar14) {
        auStack_350._0_8_ = paVar14->_M_allocated_capacity;
        auStack_350._8_8_ = puVar9[3];
      }
      else {
        auStack_350._0_8_ = paVar14->_M_allocated_capacity;
        local_360._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar9;
      }
      local_360._8_8_ = puVar9[1];
      *puVar9 = paVar14;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      cmCommand::SetError(local_368,(string *)local_360);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)auStack_350) {
      operator_delete((void *)local_360._0_8_,(ulong)(auStack_350._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p == &local_340.field_2) goto LAB_0023c24c;
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_340.field_2._M_allocated_capacity._1_7_,
                          local_340.field_2._M_local_buf[0]);
    _Var19._M_p = local_340._M_dataplus._M_p;
LAB_0023c244:
    operator_delete(_Var19._M_p,(ulong)((long)paVar14 + 1));
LAB_0023c24c:
    bVar6 = false;
    goto LAB_0023c24e;
  }
LAB_0023bd8e:
  bVar6 = cmMakefile::CanIWriteThisFile(local_368->Makefile,&local_120);
  if (!bVar6) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (auStack_350 + 0x10),"attempted to output into a file: ",&local_120);
    puVar9 = (undefined8 *)std::__cxx11::string::append(auStack_350 + 0x10);
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 == paVar14) {
      auStack_350._0_8_ = paVar14->_M_allocated_capacity;
      auStack_350._8_8_ = puVar9[3];
      local_360._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)auStack_350;
    }
    else {
      auStack_350._0_8_ = paVar14->_M_allocated_capacity;
      local_360._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar9;
    }
    local_360._8_8_ = puVar9[1];
    *puVar9 = paVar14;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    cmCommand::SetError(local_368,(string *)local_360);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)auStack_350) {
      operator_delete((void *)local_360._0_8_,(ulong)(auStack_350._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,
                      CONCAT71(local_340.field_2._M_allocated_capacity._1_7_,
                               local_340.field_2._M_local_buf[0]) + 1);
    }
    cmSystemTools::s_FatalErrorOccured = true;
    goto LAB_0023c24c;
  }
  ppVar10 = (pointer)local_1f8._0_8_;
  if (local_1f8._0_8_ == local_1f8._8_8_) {
    local_360._0_8_ = auStack_350;
    local_340._M_dataplus._M_p = (pointer)0x21;
    local_360._0_8_ =
         std::__cxx11::string::_M_create((ulong *)local_360,(ulong)(auStack_350 + 0x10));
    auStack_350._0_8_ = local_340._M_dataplus._M_p;
    *(char *)(local_360._0_8_ + 0x10) = 'C';
    *(char *)(local_360._0_8_ + 0x11) = 'O';
    *(char *)(local_360._0_8_ + 0x12) = 'M';
    *(char *)(local_360._0_8_ + 0x13) = 'M';
    *(char *)(local_360._0_8_ + 0x14) = 'A';
    *(char *)(local_360._0_8_ + 0x15) = 'N';
    *(char *)(local_360._0_8_ + 0x16) = 'D';
    *(char *)(local_360._0_8_ + 0x17) = ' ';
    *(char *)(local_360._0_8_ + 0x18) = 'a';
    *(char *)(local_360._0_8_ + 0x19) = 'r';
    *(char *)(local_360._0_8_ + 0x1a) = 'g';
    *(char *)(local_360._0_8_ + 0x1b) = 'u';
    *(char *)(local_360._0_8_ + 0x1c) = 'm';
    *(char *)(local_360._0_8_ + 0x1d) = 'e';
    *(char *)(local_360._0_8_ + 0x1e) = 'n';
    *(char *)(local_360._0_8_ + 0x1f) = 't';
    *(undefined8 *)local_360._0_8_ = 0x2064656c6c616320;
    *(char *)(local_360._0_8_ + 8) = 'w';
    *(char *)(local_360._0_8_ + 9) = 'i';
    *(char *)(local_360._0_8_ + 10) = 't';
    *(char *)(local_360._0_8_ + 0xb) = 'h';
    *(char *)(local_360._0_8_ + 0xc) = ' ';
    *(char *)(local_360._0_8_ + 0xd) = 'n';
    *(char *)(local_360._0_8_ + 0xe) = 'o';
    *(char *)(local_360._0_8_ + 0xf) = ' ';
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)(local_360._0_8_ + 0x20))->_M_local_buf[0] = '.';
    local_360._8_8_ = local_340._M_dataplus._M_p;
    *(char *)(local_360._0_8_ + (long)local_340._M_dataplus._M_p) = '\0';
    cmCommand::SetError(local_368,(string *)local_360);
LAB_0023c235:
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)auStack_350._0_8_;
    _Var19._M_p = (pointer)local_360._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)auStack_350) goto LAB_0023c244;
    goto LAB_0023c24c;
  }
  do {
    if ((((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&ppVar10->first)->_M_impl).super__Vector_impl_data._M_start ==
        (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&ppVar10->first)->_M_impl).super__Vector_impl_data._M_finish) {
      local_360._0_8_ = auStack_350;
      local_340._M_dataplus._M_p = (pointer)0x26;
      local_360._0_8_ =
           std::__cxx11::string::_M_create((ulong *)local_360,(ulong)(auStack_350 + 0x10));
      auStack_350._0_8_ = local_340._M_dataplus._M_p;
      *(char *)(local_360._0_8_ + 0x10) = 'r';
      *(char *)(local_360._0_8_ + 0x11) = 'g';
      *(char *)(local_360._0_8_ + 0x12) = 'u';
      *(char *)(local_360._0_8_ + 0x13) = 'm';
      *(char *)(local_360._0_8_ + 0x14) = 'e';
      *(char *)(local_360._0_8_ + 0x15) = 'n';
      *(char *)(local_360._0_8_ + 0x16) = 't';
      *(char *)(local_360._0_8_ + 0x17) = ' ';
      *(char *)(local_360._0_8_ + 0x18) = 'w';
      *(char *)(local_360._0_8_ + 0x19) = 'i';
      *(char *)(local_360._0_8_ + 0x1a) = 't';
      *(char *)(local_360._0_8_ + 0x1b) = 'h';
      *(char *)(local_360._0_8_ + 0x1c) = ' ';
      *(char *)(local_360._0_8_ + 0x1d) = 'n';
      *(char *)(local_360._0_8_ + 0x1e) = 'o';
      *(char *)(local_360._0_8_ + 0x1f) = ' ';
      *(undefined8 *)local_360._0_8_ = 0x43206e6576696720;
      *(char *)(local_360._0_8_ + 8) = 'O';
      *(char *)(local_360._0_8_ + 9) = 'M';
      *(char *)(local_360._0_8_ + 10) = 'M';
      *(char *)(local_360._0_8_ + 0xb) = 'A';
      *(char *)(local_360._0_8_ + 0xc) = 'N';
      *(char *)(local_360._0_8_ + 0xd) = 'D';
      *(char *)(local_360._0_8_ + 0xe) = ' ';
      *(char *)(local_360._0_8_ + 0xf) = 'a';
      *(char *)(local_360._0_8_ + 0x1e) = 'o';
      *(char *)(local_360._0_8_ + 0x1f) = ' ';
      *(char *)(local_360._0_8_ + 0x20) = 'v';
      *(char *)(local_360._0_8_ + 0x21) = 'a';
      *(char *)(local_360._0_8_ + 0x22) = 'l';
      *(char *)(local_360._0_8_ + 0x23) = 'u';
      *(char *)(local_360._0_8_ + 0x24) = 'e';
      *(char *)(local_360._0_8_ + 0x25) = '.';
      local_360._8_8_ = local_340._M_dataplus._M_p;
      *(char *)(local_360._0_8_ + (long)local_340._M_dataplus._M_p) = '\0';
      cmCommand::SetError(local_368,(string *)local_360);
      goto LAB_0023c235;
    }
    ppVar10 = (pointer)((ppVar10->second).super__Function_base._M_functor._M_pod_data + 8);
  } while (ppVar10 != (pointer)local_1f8._8_8_);
  local_2a0 = -1.0;
  if ((local_d8 != 0) && (iVar7 = __isoc99_sscanf(local_e0._M_p,"%lg",&local_2a0), iVar7 != 1)) {
    local_360._0_8_ = auStack_350;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_360," called with TIMEOUT value that could not be parsed.","");
    cmCommand::SetError(local_368,(string *)local_360);
    goto LAB_0023c235;
  }
  cp = cmsysProcess_New();
  uVar4 = local_1f8._8_8_;
  if (local_1f8._0_8_ != local_1f8._8_8_) {
    ppVar10 = (pointer)local_1f8._0_8_;
    do {
      std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_360,
                 ((long)(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&ppVar10->first)->_M_impl).super__Vector_impl_data._M_finish -
                  (long)(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&ppVar10->first)->_M_impl).super__Vector_impl_data._M_start >> 5) + 1,
                 (allocator_type *)(auStack_350 + 0x10));
      pbVar1 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&ppVar10->first)->_M_impl).super__Vector_impl_data._M_finish;
      pppVar12 = (pointer *)local_360._0_8_;
      for (pbVar20 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&ppVar10->first)->_M_impl).super__Vector_impl_data._M_start;
          pbVar20 != pbVar1; pbVar20 = pbVar20 + 1) {
        *pppVar12 = (pointer)(pbVar20->_M_dataplus)._M_p;
        pppVar12 = pppVar12 + 1;
      }
      pcVar15 = (char *)(local_360._8_8_ + -8);
      pcVar15[0] = '\0';
      pcVar15[1] = '\0';
      pcVar15[2] = '\0';
      pcVar15[3] = '\0';
      pcVar15[4] = '\0';
      pcVar15[5] = '\0';
      pcVar15[6] = '\0';
      pcVar15[7] = '\0';
      cmsysProcess_AddCommand(cp,(char **)local_360._0_8_);
      if ((pointer *)local_360._0_8_ != (pointer *)0x0) {
        operator_delete((void *)local_360._0_8_,auStack_350._0_8_ - local_360._0_8_);
      }
      ppVar10 = (pointer)((ppVar10->second).super__Function_base._M_functor._M_pod_data + 8);
    } while (ppVar10 != (pointer)uVar4);
  }
  if (local_158 != 0) {
    cmsysProcess_SetWorkingDirectory(cp,local_160._M_p);
  }
  cmsysProcess_SetOption(cp,0,1);
  if (local_138 != 0) {
    cmsysProcess_SetPipeFile(cp,1,local_140._M_p);
  }
  if (local_120._M_string_length != 0) {
    cmsysProcess_SetPipeFile(cp,2,local_120._M_dataplus._M_p);
  }
  _Var19._M_p = local_100._M_p;
  if (local_f8 == 0) {
LAB_0023bf85:
    local_320 = 0;
    if ((local_1e0._M_string_length != 0) &&
       (local_1e0._M_string_length == local_1c0._M_string_length)) {
LAB_0023bfac:
      uVar8 = bcmp(local_1e0._M_dataplus._M_p,local_1c0._M_dataplus._M_p,local_1e0._M_string_length)
      ;
      uVar16 = (ulong)uVar8;
      if (((char)local_320 != '\0') || (uVar8 == 0)) goto LAB_0023c2aa;
      local_320 = 0;
    }
  }
  else {
    if (local_f8 != local_120._M_string_length) {
LAB_0023bf75:
      cmsysProcess_SetPipeFile(cp,3,_Var19._M_p);
      goto LAB_0023bf85;
    }
    uVar8 = bcmp(local_100._M_p,local_120._M_dataplus._M_p,local_f8);
    uVar16 = (ulong)uVar8;
    if (uVar8 != 0) goto LAB_0023bf75;
    if (local_1e0._M_string_length != 0) {
      uVar16 = 0;
      local_320 = 1;
      if (local_1e0._M_string_length != local_1c0._M_string_length) goto LAB_0023c2aa;
      goto LAB_0023bfac;
    }
LAB_0023c2aa:
    local_320 = (undefined4)CONCAT71((int7)(uVar16 >> 8),1);
    cmsysProcess_SetOption(cp,2,1);
  }
  if (0.0 <= local_2a0) {
    cmsysProcess_SetTimeout(cp,local_2a0);
  }
  pcVar13 = local_368->Makefile;
  paVar14 = &local_340.field_2;
  local_340._M_dataplus._M_p = (pointer)paVar14;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(auStack_350 + 0x10),"CMAKE_EXECUTE_PROCESS_COMMAND_ECHO","");
  psVar11 = cmMakefile::GetSafeDefinition(pcVar13,(string *)(auStack_350 + 0x10));
  local_360._0_8_ = auStack_350;
  pcVar2 = (psVar11->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_360,pcVar2,pcVar2 + psVar11->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != paVar14) {
    operator_delete(local_340._M_dataplus._M_p,
                    CONCAT71(local_340.field_2._M_allocated_capacity._1_7_,
                             local_340.field_2._M_local_buf[0]) + 1);
  }
  sVar5 = local_b8;
  if (local_b8 != 0) {
    std::__cxx11::string::_M_assign((string *)local_360);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._8_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    local_2ac = std::__cxx11::string::compare(local_360);
    if ((local_2ac == 0) || (iVar7 = std::__cxx11::string::compare(local_360), iVar7 == 0)) {
      uVar4 = local_1f8._8_8_;
      local_340._M_string_length = 0;
      local_340.field_2._M_local_buf[0] = '\0';
      local_340._M_dataplus._M_p = (pointer)paVar14;
      if (local_1f8._0_8_ != local_1f8._8_8_) {
        pcVar15 = auStack_350 + 0x10;
        ppVar10 = (pointer)local_1f8._0_8_;
        do {
          std::__cxx11::string::append(pcVar15);
          cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    (&local_2d8,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)ppVar10,"\' \'");
          std::__cxx11::string::_M_append(pcVar15,(ulong)local_2d8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
            operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append(pcVar15);
          std::__cxx11::string::append(pcVar15);
          ppVar10 = (pointer)((ppVar10->second).super__Function_base._M_functor._M_pod_data + 8);
        } while (ppVar10 != (pointer)uVar4);
      }
      if (local_2ac == 0) {
        poVar17 = (ostream *)&std::cerr;
      }
      else {
        poVar17 = (ostream *)&std::cout;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar17,local_340._M_dataplus._M_p,local_340._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p,
                        CONCAT71(local_340.field_2._M_allocated_capacity._1_7_,
                                 local_340.field_2._M_local_buf[0]) + 1);
      }
      goto LAB_0023c56d;
    }
    iVar7 = std::__cxx11::string::compare(local_360);
    if (iVar7 == 0) goto LAB_0023c56d;
    local_340._M_string_length = 0;
    local_340.field_2._M_local_buf[0] = '\0';
    pcVar15 = " called with \'";
    if (sVar5 == 0) {
      pcVar15 = "CMAKE_EXECUTE_PROCESS_COMMAND_ECHO set to \'";
    }
    local_340._M_dataplus._M_p = (pointer)paVar14;
    std::__cxx11::string::operator=((string *)(auStack_350 + 0x10),pcVar15);
    std::__cxx11::string::_M_append(auStack_350 + 0x10,local_360._0_8_);
    std::__cxx11::string::append(auStack_350 + 0x10);
    if (sVar5 != 0) {
      std::__cxx11::string::append(auStack_350 + 0x10);
    }
    cmMakefile::IssueMessage(local_368->Makefile,FATAL_ERROR,(string *)(auStack_350 + 0x10));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != paVar14) {
      uVar16 = CONCAT71(local_340.field_2._M_allocated_capacity._1_7_,
                        local_340.field_2._M_local_buf[0]) + 1;
      _Var19._M_p = local_340._M_dataplus._M_p;
      goto LAB_0023cc4a;
    }
    goto LAB_0023cc4f;
  }
LAB_0023c56d:
  cmsysProcess_Execute(cp);
  local_2f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_2f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_2f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (char *)0x0;
  local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (char *)0x0;
  encoding = cmProcessOutput::FindEncoding(&local_98);
  cmProcessOutput::cmProcessOutput(&local_369,encoding,0x400);
  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
  local_340._M_string_length = 0;
  local_340.field_2._M_local_buf[0] = '\0';
  psVar11 = (string *)(auStack_350 + 0x10);
LAB_0023c5e0:
  do {
    while( true ) {
      iVar7 = cmsysProcess_WaitForData(cp,&local_2a8,&local_31c,(double *)0x0);
      if (iVar7 != 2) break;
      if (local_a0._0_1_ == false) {
        if (local_1e0._M_string_length == 0) {
          cmProcessOutput::DecodeText(&local_369,local_2a8,(long)local_31c,psVar11,1);
          cmSystemTools::Stdout(psVar11);
        }
        else {
          pvVar18 = (vector<char,std::allocator<char>> *)&local_2f8;
LAB_0023c65a:
          std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
                    (pvVar18,*(undefined8 *)(pvVar18 + 8));
        }
      }
    }
    if (iVar7 == 3) {
      if (local_a0._1_1_ == false) {
        pvVar18 = (vector<char,std::allocator<char>> *)&local_318;
        if (local_1c0._M_string_length != 0) goto LAB_0023c65a;
        cmProcessOutput::DecodeText(&local_369,local_2a8,(long)local_31c,psVar11,2);
        cmSystemTools::Stderr(psVar11);
      }
      goto LAB_0023c5e0;
    }
  } while (iVar7 != 0);
  if ((local_a0._0_1_ == false) && (local_1e0._M_string_length == 0)) {
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    cmProcessOutput::DecodeText(&local_369,&local_50,(string *)(auStack_350 + 0x10),1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
    if (local_340._M_string_length != 0) {
      cmSystemTools::Stdout((string *)(auStack_350 + 0x10));
    }
  }
  if ((local_a0._1_1_ == false) && (local_1c0._M_string_length == 0)) {
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    cmProcessOutput::DecodeText(&local_369,&local_70,(string *)(auStack_350 + 0x10),2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
    if (local_340._M_string_length != 0) {
      cmSystemTools::Stderr((string *)(auStack_350 + 0x10));
    }
  }
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  local_278._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_278._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_278._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<char,_std::allocator<char>_>::_M_create_storage
            (&local_278,
             (long)local_2f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_2f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start);
  pcVar3 = local_278._M_impl.super__Vector_impl_data._M_start;
  sVar21 = (long)local_2f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_2f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (sVar21 != 0) {
    memmove(local_278._M_impl.super__Vector_impl_data._M_start,
            local_2f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start,sVar21);
  }
  local_278._M_impl.super__Vector_impl_data._M_finish = pcVar3 + sVar21;
  cmProcessOutput::DecodeText
            (&local_369,(vector<char,_std::allocator<char>_> *)&local_278,&local_2f8,0);
  if (local_278._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278._M_impl.super__Vector_impl_data._M_start);
  }
  local_298._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_298._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<char,_std::allocator<char>_>::_M_create_storage
            (&local_298,
             (long)local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start);
  pcVar3 = local_298._M_impl.super__Vector_impl_data._M_start;
  sVar21 = (long)local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (sVar21 != 0) {
    memmove(local_298._M_impl.super__Vector_impl_data._M_start,
            local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start,sVar21);
  }
  local_298._M_impl.super__Vector_impl_data._M_finish = pcVar3 + sVar21;
  cmProcessOutput::DecodeText
            (&local_369,(vector<char,_std::allocator<char>_> *)&local_298,&local_318,0);
  if (local_298._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_298._M_impl.super__Vector_impl_data._M_start,
                    (long)local_298._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_298._M_impl.super__Vector_impl_data._M_start);
  }
  cmExecuteProcessCommandFixText(&local_2f8,local_a0._2_1_);
  cmExecuteProcessCommandFixText(&local_318,local_a0._3_1_);
  if ((local_1e0._M_string_length != 0) &&
     (local_2f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_2f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish)) {
    cmMakefile::AddDefinition
              (local_368->Makefile,&local_1e0,
               local_2f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  if (((char)local_320 == '\0' && local_1c0._M_string_length != 0) &&
     (local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish)) {
    cmMakefile::AddDefinition
              (local_368->Makefile,&local_1c0,
               local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  if (local_1a0._M_string_length == 0) goto switchD_0023c985_caseD_3;
  iVar7 = cmsysProcess_GetState(cp);
  switch(iVar7) {
  case 1:
    pcVar13 = local_368->Makefile;
    pcVar15 = cmsysProcess_GetErrorString(cp);
    goto LAB_0023c9e9;
  case 2:
    pcVar13 = local_368->Makefile;
    pcVar15 = cmsysProcess_GetExceptionString(cp);
LAB_0023c9e9:
    cmMakefile::AddDefinition(pcVar13,&local_1a0,pcVar15);
    break;
  case 4:
    uVar8 = cmsysProcess_GetExitValue(cp);
    sprintf((char *)&local_2d8,"%d",(ulong)uVar8);
    cmMakefile::AddDefinition(local_368->Makefile,&local_1a0,(char *)&local_2d8);
    break;
  case 5:
    cmMakefile::AddDefinition(local_368->Makefile,&local_1a0,"Process terminated due to timeout");
  }
switchD_0023c985_caseD_3:
  if (local_180._M_string_length == 0) goto switchD_0023ca4b_caseD_3;
  iVar7 = cmsysProcess_GetState(cp);
  switch(iVar7) {
  case 1:
    pcVar13 = local_368->Makefile;
    pcVar15 = cmsysProcess_GetErrorString(cp);
    goto LAB_0023cbc3;
  case 2:
    pcVar13 = local_368->Makefile;
    pcVar15 = cmsysProcess_GetExceptionString(cp);
LAB_0023cbc3:
    cmMakefile::AddDefinition(pcVar13,&local_180,pcVar15);
    break;
  case 4:
    local_218.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_218.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_218.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_1f8._8_8_ != local_1f8._0_8_) {
      uVar16 = 0;
      do {
        idx = (int)uVar16;
        iVar7 = cmsysProcess_GetStateByIndex(cp,idx);
        if (iVar7 == 2) {
          local_2d8._M_dataplus._M_p = cmsysProcess_GetExceptionStringByIndex(cp,idx);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_218
                     ,(char **)&local_2d8);
        }
        else if (iVar7 == 4) {
          uVar8 = cmsysProcess_GetExitValueByIndex(cp,idx);
          sprintf((char *)&local_2d8,"%d",(ulong)uVar8);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char(&)[16]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_218
                     ,(char (*) [16])&local_2d8);
        }
        else {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[36]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_218
                     ,(char (*) [36])"Error getting the child return code");
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 < (ulong)(((long)(local_1f8._8_8_ - local_1f8._0_8_) >> 3) *
                               -0x5555555555555555));
    }
    pcVar13 = local_368->Makefile;
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_2d8,&local_218,";");
    cmMakefile::AddDefinition(pcVar13,&local_180,local_2d8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_218);
    break;
  case 5:
    cmMakefile::AddDefinition(local_368->Makefile,&local_180,"Process terminated due to timeout");
  }
switchD_0023ca4b_caseD_3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,
                    CONCAT71(local_340.field_2._M_allocated_capacity._1_7_,
                             local_340.field_2._M_local_buf[0]) + 1);
  }
  cmProcessOutput::~cmProcessOutput(&local_369);
  if (local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_318.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    uVar16 = (long)local_2f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage -
             (long)local_2f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    _Var19._M_p = local_2f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
LAB_0023cc4a:
    operator_delete(_Var19._M_p,uVar16);
  }
LAB_0023cc4f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)auStack_350) {
    operator_delete((void *)local_360._0_8_,(ulong)(auStack_350._0_8_ + 1));
  }
  bVar6 = true;
  if (cp != (cmsysProcess *)0x0) {
    cmsysProcess_Delete(cp);
  }
LAB_0023c24e:
  InitialPass::Arguments::~Arguments((Arguments *)local_1f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_258);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_238);
  return bVar6;
}

Assistant:

bool cmExecuteProcessCommand::InitialPass(std::vector<std::string> const& args,
                                          cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  struct Arguments
  {
    std::vector<std::vector<std::string>> Commands;
    std::string OutputVariable;
    std::string ErrorVariable;
    std::string ResultVariable;
    std::string ResultsVariable;
    std::string WorkingDirectory;
    std::string InputFile;
    std::string OutputFile;
    std::string ErrorFile;
    std::string Timeout;
    std::string CommandEcho;
    bool OutputQuiet = false;
    bool ErrorQuiet = false;
    bool OutputStripTrailingWhitespace = false;
    bool ErrorStripTrailingWhitespace = false;
    std::string Encoding;
  };

  static auto const parser =
    cmArgumentParser<Arguments>{}
      .Bind("COMMAND"_s, &Arguments::Commands)
      .Bind("COMMAND_ECHO"_s, &Arguments::CommandEcho)
      .Bind("OUTPUT_VARIABLE"_s, &Arguments::OutputVariable)
      .Bind("ERROR_VARIABLE"_s, &Arguments::ErrorVariable)
      .Bind("RESULT_VARIABLE"_s, &Arguments::ResultVariable)
      .Bind("RESULTS_VARIABLE"_s, &Arguments::ResultsVariable)
      .Bind("WORKING_DIRECTORY"_s, &Arguments::WorkingDirectory)
      .Bind("INPUT_FILE"_s, &Arguments::InputFile)
      .Bind("OUTPUT_FILE"_s, &Arguments::OutputFile)
      .Bind("ERROR_FILE"_s, &Arguments::ErrorFile)
      .Bind("TIMEOUT"_s, &Arguments::Timeout)
      .Bind("OUTPUT_QUIET"_s, &Arguments::OutputQuiet)
      .Bind("ERROR_QUIET"_s, &Arguments::ErrorQuiet)
      .Bind("OUTPUT_STRIP_TRAILING_WHITESPACE"_s,
            &Arguments::OutputStripTrailingWhitespace)
      .Bind("ERROR_STRIP_TRAILING_WHITESPACE"_s,
            &Arguments::ErrorStripTrailingWhitespace)
      .Bind("ENCODING"_s, &Arguments::Encoding);

  std::vector<std::string> unparsedArguments;
  std::vector<std::string> keywordsMissingValue;
  Arguments const arguments =
    parser.Parse(args, &unparsedArguments, &keywordsMissingValue);

  if (!keywordsMissingValue.empty()) {
    this->SetError(" called with no value for " +
                   keywordsMissingValue.front() + ".");
    return false;
  }
  if (!unparsedArguments.empty()) {
    this->SetError(" given unknown argument \"" + unparsedArguments.front() +
                   "\".");
    return false;
  }

  if (!this->Makefile->CanIWriteThisFile(arguments.OutputFile)) {
    this->SetError("attempted to output into a file: " + arguments.OutputFile +
                   " into a source directory.");
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }

  // Check for commands given.
  if (arguments.Commands.empty()) {
    this->SetError(" called with no COMMAND argument.");
    return false;
  }
  for (std::vector<std::string> const& cmd : arguments.Commands) {
    if (cmd.empty()) {
      this->SetError(" given COMMAND argument with no value.");
      return false;
    }
  }

  // Parse the timeout string.
  double timeout = -1;
  if (!arguments.Timeout.empty()) {
    if (sscanf(arguments.Timeout.c_str(), "%lg", &timeout) != 1) {
      this->SetError(" called with TIMEOUT value that could not be parsed.");
      return false;
    }
  }
  // Create a process instance.
  std::unique_ptr<cmsysProcess, void (*)(cmsysProcess*)> cp_ptr(
    cmsysProcess_New(), cmsysProcess_Delete);
  cmsysProcess* cp = cp_ptr.get();

  // Set the command sequence.
  for (std::vector<std::string> const& cmd : arguments.Commands) {
    std::vector<const char*> argv(cmd.size() + 1);
    std::transform(cmd.begin(), cmd.end(), argv.begin(),
                   [](std::string const& s) { return s.c_str(); });
    argv.back() = nullptr;
    cmsysProcess_AddCommand(cp, argv.data());
  }

  // Set the process working directory.
  if (!arguments.WorkingDirectory.empty()) {
    cmsysProcess_SetWorkingDirectory(cp, arguments.WorkingDirectory.c_str());
  }

  // Always hide the process window.
  cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);

  // Check the output variables.
  bool merge_output = false;
  if (!arguments.InputFile.empty()) {
    cmsysProcess_SetPipeFile(cp, cmsysProcess_Pipe_STDIN,
                             arguments.InputFile.c_str());
  }
  if (!arguments.OutputFile.empty()) {
    cmsysProcess_SetPipeFile(cp, cmsysProcess_Pipe_STDOUT,
                             arguments.OutputFile.c_str());
  }
  if (!arguments.ErrorFile.empty()) {
    if (arguments.ErrorFile == arguments.OutputFile) {
      merge_output = true;
    } else {
      cmsysProcess_SetPipeFile(cp, cmsysProcess_Pipe_STDERR,
                               arguments.ErrorFile.c_str());
    }
  }
  if (!arguments.OutputVariable.empty() &&
      arguments.OutputVariable == arguments.ErrorVariable) {
    merge_output = true;
  }
  if (merge_output) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_MergeOutput, 1);
  }

  // Set the timeout if any.
  if (timeout >= 0) {
    cmsysProcess_SetTimeout(cp, timeout);
  }

  bool echo_stdout = false;
  bool echo_stderr = false;
  bool echo_output_from_variable = true;
  std::string echo_output =
    this->Makefile->GetSafeDefinition("CMAKE_EXECUTE_PROCESS_COMMAND_ECHO");
  if (!arguments.CommandEcho.empty()) {
    echo_output_from_variable = false;
    echo_output = arguments.CommandEcho;
  }

  if (!echo_output.empty()) {
    if (echo_output == "STDERR") {
      echo_stderr = true;
    } else if (echo_output == "STDOUT") {
      echo_stdout = true;
    } else if (echo_output != "NONE") {
      std::string error;
      if (echo_output_from_variable) {
        error = "CMAKE_EXECUTE_PROCESS_COMMAND_ECHO set to '";
      } else {
        error = " called with '";
      }
      error += echo_output;
      error += "' expected STDERR|STDOUT|NONE";
      if (!echo_output_from_variable) {
        error += " for COMMAND_ECHO.";
      }
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, error);
      return true;
    }
  }
  if (echo_stdout || echo_stderr) {
    std::string command;
    for (auto& cmd : arguments.Commands) {
      command += "'";
      command += cmJoin(cmd, "' '");
      command += "'";
      command += "\n";
    }
    if (echo_stdout) {
      std::cout << command;
    } else if (echo_stderr) {
      std::cerr << command;
    }
  }
  // Start the process.
  cmsysProcess_Execute(cp);

  // Read the process output.
  std::vector<char> tempOutput;
  std::vector<char> tempError;
  int length;
  char* data;
  int p;
  cmProcessOutput processOutput(
    cmProcessOutput::FindEncoding(arguments.Encoding));
  std::string strdata;
  while ((p = cmsysProcess_WaitForData(cp, &data, &length, nullptr))) {
    // Put the output in the right place.
    if (p == cmsysProcess_Pipe_STDOUT && !arguments.OutputQuiet) {
      if (arguments.OutputVariable.empty()) {
        processOutput.DecodeText(data, length, strdata, 1);
        cmSystemTools::Stdout(strdata);
      } else {
        cmExecuteProcessCommandAppend(tempOutput, data, length);
      }
    } else if (p == cmsysProcess_Pipe_STDERR && !arguments.ErrorQuiet) {
      if (arguments.ErrorVariable.empty()) {
        processOutput.DecodeText(data, length, strdata, 2);
        cmSystemTools::Stderr(strdata);
      } else {
        cmExecuteProcessCommandAppend(tempError, data, length);
      }
    }
  }
  if (!arguments.OutputQuiet && arguments.OutputVariable.empty()) {
    processOutput.DecodeText(std::string(), strdata, 1);
    if (!strdata.empty()) {
      cmSystemTools::Stdout(strdata);
    }
  }
  if (!arguments.ErrorQuiet && arguments.ErrorVariable.empty()) {
    processOutput.DecodeText(std::string(), strdata, 2);
    if (!strdata.empty()) {
      cmSystemTools::Stderr(strdata);
    }
  }

  // All output has been read.  Wait for the process to exit.
  cmsysProcess_WaitForExit(cp, nullptr);
  processOutput.DecodeText(tempOutput, tempOutput);
  processOutput.DecodeText(tempError, tempError);

  // Fix the text in the output strings.
  cmExecuteProcessCommandFixText(tempOutput,
                                 arguments.OutputStripTrailingWhitespace);
  cmExecuteProcessCommandFixText(tempError,
                                 arguments.ErrorStripTrailingWhitespace);

  // Store the output obtained.
  if (!arguments.OutputVariable.empty() && !tempOutput.empty()) {
    this->Makefile->AddDefinition(arguments.OutputVariable, tempOutput.data());
  }
  if (!merge_output && !arguments.ErrorVariable.empty() &&
      !tempError.empty()) {
    this->Makefile->AddDefinition(arguments.ErrorVariable, tempError.data());
  }

  // Store the result of running the process.
  if (!arguments.ResultVariable.empty()) {
    switch (cmsysProcess_GetState(cp)) {
      case cmsysProcess_State_Exited: {
        int v = cmsysProcess_GetExitValue(cp);
        char buf[16];
        sprintf(buf, "%d", v);
        this->Makefile->AddDefinition(arguments.ResultVariable, buf);
      } break;
      case cmsysProcess_State_Exception:
        this->Makefile->AddDefinition(arguments.ResultVariable,
                                      cmsysProcess_GetExceptionString(cp));
        break;
      case cmsysProcess_State_Error:
        this->Makefile->AddDefinition(arguments.ResultVariable,
                                      cmsysProcess_GetErrorString(cp));
        break;
      case cmsysProcess_State_Expired:
        this->Makefile->AddDefinition(arguments.ResultVariable,
                                      "Process terminated due to timeout");
        break;
    }
  }
  // Store the result of running the processes.
  if (!arguments.ResultsVariable.empty()) {
    switch (cmsysProcess_GetState(cp)) {
      case cmsysProcess_State_Exited: {
        std::vector<std::string> res;
        for (size_t i = 0; i < arguments.Commands.size(); ++i) {
          switch (cmsysProcess_GetStateByIndex(cp, static_cast<int>(i))) {
            case kwsysProcess_StateByIndex_Exited: {
              int exitCode =
                cmsysProcess_GetExitValueByIndex(cp, static_cast<int>(i));
              char buf[16];
              sprintf(buf, "%d", exitCode);
              res.emplace_back(buf);
            } break;
            case kwsysProcess_StateByIndex_Exception:
              res.emplace_back(cmsysProcess_GetExceptionStringByIndex(
                cp, static_cast<int>(i)));
              break;
            case kwsysProcess_StateByIndex_Error:
            default:
              res.emplace_back("Error getting the child return code");
              break;
          }
        }
        this->Makefile->AddDefinition(arguments.ResultsVariable,
                                      cmJoin(res, ";").c_str());
      } break;
      case cmsysProcess_State_Exception:
        this->Makefile->AddDefinition(arguments.ResultsVariable,
                                      cmsysProcess_GetExceptionString(cp));
        break;
      case cmsysProcess_State_Error:
        this->Makefile->AddDefinition(arguments.ResultsVariable,
                                      cmsysProcess_GetErrorString(cp));
        break;
      case cmsysProcess_State_Expired:
        this->Makefile->AddDefinition(arguments.ResultsVariable,
                                      "Process terminated due to timeout");
        break;
    }
  }

  return true;
}